

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Mat.cpp
# Opt level: O0

Mat __thiscall Mat::GetCol(Mat *this,int iCol)

{
  int in_EDX;
  double *extraout_RDX;
  double *pdVar1;
  undefined4 in_register_00000034;
  int *piVar2;
  Mat MVar3;
  int local_24;
  int i;
  int iCol_local;
  Mat *this_local;
  Mat *Col;
  
  piVar2 = (int *)CONCAT44(in_register_00000034,iCol);
  Mat(this,*piVar2);
  pdVar1 = extraout_RDX;
  for (local_24 = 0; local_24 < *piVar2; local_24 = local_24 + 1) {
    pdVar1 = (double *)(long)(piVar2[1] * local_24 + in_EDX);
    this->v_[local_24] = *(double *)(*(long *)(piVar2 + 2) + (long)pdVar1 * 8);
  }
  MVar3.v_ = pdVar1;
  MVar3._0_8_ = this;
  return MVar3;
}

Assistant:

Mat Mat::GetCol(int iCol)
{
	Mat Col(n_rows_);
	for ( int i = 0;  i< n_rows_; i++)
		Col.v_[i] = v_[n_cols_ * i+iCol];
	return Col;
}